

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O2

void aiSetImportPropertyMatrix(aiPropertyStore *p,char *szName,aiMatrix4x4 *mat)

{
  if (mat != (aiMatrix4x4 *)0x0) {
    SetGenericProperty<aiMatrix4x4t<float>>
              ((map<unsigned_int,_aiMatrix4x4t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
                *)(p + 0x90),szName,mat);
  }
  return;
}

Assistant:

ASSIMP_API void aiSetImportPropertyMatrix(aiPropertyStore* p, const char* szName,
    const C_STRUCT aiMatrix4x4* mat)
{
    if (!mat) {
        return;
    }
    ASSIMP_BEGIN_EXCEPTION_REGION();
    PropertyMap* pp = reinterpret_cast<PropertyMap*>(p);
    SetGenericProperty<aiMatrix4x4>(pp->matrices,szName,*mat);
    ASSIMP_END_EXCEPTION_REGION(void);
}